

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall
ImPool<ImGuiDockContextPruneNodeData>::~ImPool(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  ImPool<ImGuiDockContextPruneNodeData> *this_local;
  
  Clear(this);
  ImGuiStorage::~ImGuiStorage(&this->Map);
  ImVector<ImGuiDockContextPruneNodeData>::~ImVector(&this->Buf);
  return;
}

Assistant:

~ImPool()   { Clear(); }